

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O1

JsErrorCode JsDiagGetBreakpoints(JsValueRef *breakpoints)

{
  JsrtRuntime *this;
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  int iVar4;
  JsrtContext *pJVar5;
  JsrtDebugManager *this_00;
  undefined4 *puVar6;
  ScriptContext *pSVar7;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_80 [8];
  EnterScriptObject __enterScriptObject;
  ThreadContextScope scope;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar5 = JsrtContext::GetCurrent();
  JVar3 = CheckContext(pJVar5,false,false);
  if (JVar3 == JsNoError) {
    pSVar7 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_b8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_80,pSVar7,(ScriptEntryExitRecord *)auStack_b8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(pSVar7,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_80);
    if (breakpoints == (JsValueRef *)0x0) {
      JVar3 = JsErrorNullArgument;
    }
    else {
      *breakpoints = (JsValueRef)0x0;
      pJVar5 = JsrtContext::GetCurrent();
      this = (pJVar5->runtime).ptr;
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&__enterScriptObject.library,this->threadContext);
      JVar3 = JsErrorWrongThread;
      if (__enterScriptObject.library._1_1_ == '\x01') {
        this_00 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar3 = JsErrorDiagNotInDebugMode;
        if (this_00 != (JsrtDebugManager *)0x0) {
          bVar2 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
          if (bVar2) {
            scope.originalContext =
                 (ThreadContext *)
                 Js::JavascriptLibrary::CreateArray
                           ((((((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                              scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary);
            pSVar7 = this->threadContext->scriptContextList;
            if (pSVar7 != (ScriptContext *)0x0) {
              do {
                iVar4 = (*(pSVar7->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar7);
                if ((char)iVar4 != '\0') break;
                JsrtDebugManager::GetBreakpoints
                          (this_00,(JavascriptArray **)&scope.originalContext,pSVar7);
                pSVar7 = pSVar7->next;
              } while (pSVar7 != (ScriptContext *)0x0);
            }
            *breakpoints = scope.originalContext;
            JVar3 = JsNoError;
          }
        }
      }
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&__enterScriptObject.library);
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_80);
    if ((((JVar3 & 0x6ffff) == JsErrorOutOfMemory) ||
        (((JVar3 - JsErrorNoCurrentContext < 7 &&
          ((0x43U >> (JVar3 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar3 == JsErrorFatal)
         ))) || (JVar3 == JsErrorScriptTerminated)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0xcc,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsDiagGetBreakpoints(
    _Out_ JsValueRef *breakpoints)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(breakpoints);
        *breakpoints = JS_INVALID_REFERENCE;

        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        Js::JavascriptArray* bpsArray = currentContext->GetScriptContext()->GetLibrary()->CreateArray();

        for (Js::ScriptContext* currentScriptContext = runtime->GetThreadContext()->GetScriptContextList();
            currentScriptContext != nullptr && !currentScriptContext->IsClosed();
            currentScriptContext = currentScriptContext->next)
        {
            jsrtDebugManager->GetBreakpoints(&bpsArray, currentScriptContext);
        }

        *breakpoints = bpsArray;
        return JsNoError;
    });
#endif
}